

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  int i;
  int iVar2;
  ImGuiWindow *window_local;
  
  window_local = window;
  ImVector<ImGuiWindow_*>::push_back(out_sorted_windows,&window_local);
  if (window_local->Active == true) {
    iVar2 = (window_local->DC).ChildWindows.Size;
    if (1 < (long)iVar2) {
      qsort((window_local->DC).ChildWindows.Data,(long)iVar2,8,ChildWindowComparer);
    }
    i = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != i; i = i + 1) {
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&(window_local->DC).ChildWindows,i);
      if ((*ppIVar1)->Active == true) {
        AddWindowToSortBuffer(out_sorted_windows,*ppIVar1);
      }
    }
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            ImQsort(window->DC.ChildWindows.Data, (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}